

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

CPAccessResult gt_cntfrq_access(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  int iVar1;
  uint32_t uVar2;
  int iVar3;
  uint64_t uVar4;
  
  iVar1 = arm_current_el(env);
  if (iVar1 == 1) {
    if (isread) {
      return CP_ACCESS_OK;
    }
    if (((ri->state == 0) && ((env->features & 0x200000000) != 0)) &&
       (((env->cp15).scr_el3 & 1) == 0)) {
      return CP_ACCESS_TRAP_UNCATEGORIZED;
    }
  }
  else {
    if (iVar1 == 0) {
      uVar4 = arm_hcr_el2_eff_aarch64(env);
      if ((~uVar4 & 0x408000000) == 0) {
        uVar2 = (env->cp15).cnthctl_el2;
      }
      else {
        uVar2 = (uint32_t)(env->cp15).c14_cntkctl;
      }
      uVar2 = extract32(uVar2,0,2);
      if (uVar2 == 0) {
        return CP_ACCESS_TRAP;
      }
    }
    if (isread) {
      return CP_ACCESS_OK;
    }
  }
  iVar3 = 3;
  if ((env->features >> 0x21 & 1) == 0) {
    iVar3 = ((env->features >> 0x20 & 1) != 0) + 1;
  }
  if (iVar3 <= iVar1) {
    return CP_ACCESS_OK;
  }
  return CP_ACCESS_TRAP_UNCATEGORIZED;
}

Assistant:

static CPAccessResult gt_cntfrq_access(CPUARMState *env, const ARMCPRegInfo *ri,
                                       bool isread)
{
    /* CNTFRQ: not visible from PL0 if both PL0PCTEN and PL0VCTEN are zero.
     * Writable only at the highest implemented exception level.
     */
    int el = arm_current_el(env);
    uint64_t hcr;
    uint32_t cntkctl;

    switch (el) {
    case 0:
        hcr = arm_hcr_el2_eff(env);
        if ((hcr & (HCR_E2H | HCR_TGE)) == (HCR_E2H | HCR_TGE)) {
            cntkctl = env->cp15.cnthctl_el2;
        } else {
            cntkctl = env->cp15.c14_cntkctl;
        }
        if (!extract32(cntkctl, 0, 2)) {
            return CP_ACCESS_TRAP;
        }
        break;
    case 1:
        if (!isread && ri->state == ARM_CP_STATE_AA32 &&
            arm_is_secure_below_el3(env)) {
            /* Accesses from 32-bit Secure EL1 UNDEF (*not* trap to EL3!) */
            return CP_ACCESS_TRAP_UNCATEGORIZED;
        }
        break;
    case 2:
    case 3:
        break;
    }

    if (!isread && el < arm_highest_el(env)) {
        return CP_ACCESS_TRAP_UNCATEGORIZED;
    }

    return CP_ACCESS_OK;
}